

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_vhost_active_conns(lws *wsi,lws **nwsi,char *adsin)

{
  lws **pplVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  lws_log_cx *plVar5;
  uint uVar6;
  char *pcVar7;
  char *local_90;
  lws *local_68;
  lws *w_1;
  lws_dll2 *d1;
  lws_dll2 *d;
  lws *w;
  char *pcStack_40;
  char newconn_cannot_use_h1;
  char *my_alpn;
  char *adsin_local;
  lws **nwsi_local;
  lws *wsi_local;
  
  my_alpn = adsin;
  adsin_local = (char *)nwsi;
  nwsi_local = (lws **)wsi;
  pcStack_40 = lws_wsi_client_stash_item(wsi,7,0x5f);
  w._7_1_ = '\0';
  if (((((ulong)nwsi_local[0x86] & 1) != 0) && (pcStack_40 != (char *)0x0)) &&
     (pcVar4 = strstr(pcStack_40,"http/1.1"), pcVar4 == (char *)0x0)) {
    w._7_1_ = '\x01';
  }
  iVar2 = lws_dll2_is_detached((lws_dll2 *)(nwsi_local + 0x56));
  if (iVar2 == 0) {
    *(uint32_t **)adsin_local = &nwsi_local[0x58][-1].sul_hrtimer.latency_us;
    wsi_local._4_4_ = 2;
  }
  else if (nwsi_local[0x1b] == (lws *)0x0) {
    d1 = (nwsi_local[1]->dll_cli_active_conns).prev;
    while (d1 != (lws_dll2 *)0x0) {
      w_1 = (lws *)d1->next;
      local_68 = (lws *)&d1[-0x1c].next;
      plVar5 = lwsl_wsi_get_cx((lws *)nwsi_local);
      pplVar1 = nwsi_local;
      pcVar4 = lws_wsi_tag(local_68);
      if (local_68->cli_hostname_copy == (char *)0x0) {
        local_90 = "null";
      }
      else {
        local_90 = local_68->cli_hostname_copy;
      }
      uVar6 = (uint)*(ushort *)((long)nwsi_local + 0x47a);
      uVar3 = (uint)local_68->c_port;
      pcVar7 = my_alpn;
      _lws_log_cx(plVar5,lws_log_prepend_wsi,pplVar1,0x10,"lws_vhost_active_conns",
                  "check %s %s %s %d %d",pcVar4,my_alpn,local_90,uVar6,uVar3);
      if ((((local_68 != (lws *)nwsi_local) &&
           ((((lws *)local_68->role_ops == nwsi_local[0x6c] ||
             (((local_68->role_ops == &role_ops_h1 || (local_68->role_ops == &role_ops_h2)) &&
              ((nwsi_local[0x6c] == (lws *)&role_ops_h1 || (nwsi_local[0x6c] == (lws *)&role_ops_h2)
               ))))) &&
            ((local_68->cli_hostname_copy != (char *)0x0 &&
             (iVar2 = strcmp(my_alpn,local_68->cli_hostname_copy), iVar2 == 0)))))) &&
          ((w._7_1_ == '\0' || (local_68->role_ops != &role_ops_h1)))) &&
         (((*(uint *)(nwsi_local + 0x86) & 1) == ((local_68->tls).use_ssl & 1) &&
          (*(uint16_t *)((long)nwsi_local + 0x47a) == local_68->c_port)))) {
        if ((*(ulong *)&local_68->field_0x46e >> 0x37 & 1) == 0) {
          if ((((*(ulong *)&local_68->field_0x46e >> 0x3a & 1) != 0) &&
              ((*(ulong *)&local_68->field_0x46e >> 0x3c & 1) != 0)) &&
             (((local_68->wsistate & 0xffff) == 0x10f ||
              (((local_68->wsistate & 0xffff) == 0x119 || ((local_68->wsistate & 0xffff) == 0x11))))
             )) {
            plVar5 = lwsl_wsi_get_cx(local_68);
            _lws_log_cx(plVar5,lws_log_prepend_wsi,local_68,4,"lws_vhost_active_conns",
                        "just join h2 directly 0x%x",
                        CONCAT44((int)((ulong)pcVar4 >> 0x20),local_68->wsistate) &
                        0xffffffff0000ffff,pcVar7,local_90,uVar6,uVar3);
            if ((local_68->wsistate & 0xffff) == 0x11) {
              _lws_generic_transaction_completed_active_conn(&local_68,'\0');
            }
            *(ulong *)((long)nwsi_local + 0x46e) =
                 *(ulong *)((long)nwsi_local + 0x46e) & 0xfbffffffffffffff | 0x400000000000000;
            lws_wsi_h2_adopt(local_68,(lws *)nwsi_local);
            *(lws **)adsin_local = local_68;
            return 1;
          }
          plVar5 = lwsl_wsi_get_cx((lws *)nwsi_local);
          pplVar1 = nwsi_local;
          pcVar4 = lws_wsi_tag(local_68);
          _lws_log_cx(plVar5,lws_log_prepend_wsi,pplVar1,4,"lws_vhost_active_conns",
                      "apply txn queue %s, state 0x%lx",pcVar4,(ulong)local_68->wsistate,local_90,
                      uVar6,uVar3);
          lws_dll2_add_tail((lws_dll2 *)(nwsi_local + 0x56),&local_68->dll2_cli_txn_queue_owner);
          if ((local_68->wsistate & 0xffff) == 0x11) {
            _lws_generic_transaction_completed_active_conn(&local_68,'\0');
          }
          *(lws **)adsin_local = local_68;
          return 2;
        }
        plVar5 = lwsl_wsi_get_cx(local_68);
        _lws_log_cx(plVar5,lws_log_prepend_wsi,local_68,4,"lws_vhost_active_conns",
                    "defeating pipelining",pcVar4,pcVar7,local_90,uVar6,uVar3);
        break;
      }
      d1 = (lws_dll2 *)w_1;
    }
    wsi_local._4_4_ = 0;
  }
  else {
    *(lws **)adsin_local = nwsi_local[0x1b];
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_vhost_active_conns(struct lws *wsi, struct lws **nwsi, const char *adsin)
{
#if defined(LWS_WITH_TLS)
	const char *my_alpn = lws_wsi_client_stash_item(wsi, CIS_ALPN,
							_WSI_TOKEN_CLIENT_ALPN);
#endif
#if defined(LWS_WITH_TLS)
	char newconn_cannot_use_h1 = 0;

	if ((wsi->tls.use_ssl & LCCSCF_USE_SSL) &&
	    my_alpn && !strstr(my_alpn, "http/1.1"))
		/*
		 * new guy wants to use tls, he specifies the alpn and he does
		 * not list h1 as a choice ==> he can't bind to existing h1
		 */
		newconn_cannot_use_h1 = 1;
#endif

	if (!lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		struct lws *w = lws_container_of(
				wsi->dll2_cli_txn_queue.owner, struct lws,
				dll2_cli_txn_queue_owner);
		*nwsi = w;

		return ACTIVE_CONNS_QUEUED;
	}

#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	if (wsi->mux.parent_wsi) {
		/*
		 * We already decided...
		 */

		*nwsi = wsi->mux.parent_wsi;

		return ACTIVE_CONNS_MUXED;
	}
#endif

	lws_context_lock(wsi->a.context, __func__); /* -------------- cx { */
	lws_vhost_lock(wsi->a.vhost); /* ----------------------------------- { */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   wsi->a.vhost->dll_cli_active_conns_owner.head) {
		struct lws *w = lws_container_of(d, struct lws,
						 dll_cli_active_conns);

		lwsl_wsi_debug(wsi, "check %s %s %s %d %d",
				    lws_wsi_tag(w), adsin,
				    w->cli_hostname_copy ? w->cli_hostname_copy :
							    "null",
				    wsi->c_port, w->c_port);

		if (w != wsi &&
		    /*
		     * "same internet protocol"... this is a bit tricky,
		     * since h2 start out as h1, and may stay at h1.
		     *
		     * But an idle h1 connection cannot be used by a connection
		     * request that doesn't have http/1.1 in its alpn list...
		     */
		    (w->role_ops == wsi->role_ops ||
		     (lwsi_role_http(w) && lwsi_role_http(wsi))) &&
		     /* ... same role, or at least both some kind of http */
		    w->cli_hostname_copy && !strcmp(adsin, w->cli_hostname_copy) &&
		    /* same endpoint hostname */
#if defined(LWS_WITH_TLS)
		   !(newconn_cannot_use_h1 && w->role_ops == &role_ops_h1) &&
		   /* if we can't use h1, old guy must not be h1 */
		    (wsi->tls.use_ssl & LCCSCF_USE_SSL) ==
		     (w->tls.use_ssl & LCCSCF_USE_SSL) &&
		     /* must both agree on tls use or not */
#endif
		    wsi->c_port == w->c_port) {
			/* same endpoint port */

			/*
			 * There's already an active connection.
			 *
			 * The server may have told the existing active
			 * connection that it doesn't support pipelining...
			 */
			if (w->keepalive_rejected) {
				lwsl_wsi_notice(w, "defeating pipelining");
				goto solo;
			}

#if defined(LWS_WITH_HTTP2)
			/*
			 * h2: if in usable state already: just use it without
			 *     going through the queue
			 */
			if (w->client_h2_alpn && w->client_mux_migrated &&
			    (lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS ||
			     lwsi_state(w) == LRS_ESTABLISHED ||
			     lwsi_state(w) == LRS_IDLING)) {

				lwsl_wsi_notice(w, "just join h2 directly 0x%x",
						   lwsi_state(w));

				if (lwsi_state(w) == LRS_IDLING)
					_lws_generic_transaction_completed_active_conn(&w, 0);

				//lwsi_set_state(w, LRS_H1C_ISSUE_HANDSHAKE2);

				wsi->client_h2_alpn = 1;
				lws_wsi_h2_adopt(w, wsi);
				lws_vhost_unlock(wsi->a.vhost); /* } ---------- */
				lws_context_unlock(wsi->a.context); /* -------------- cx { */

				*nwsi = w;

				return ACTIVE_CONNS_MUXED;
			}
#endif

#if defined(LWS_ROLE_MQTT)
			/*
			 * MQTT: if in usable state already: just use it without
			 *	 going through the queue
			 */

			if (lwsi_role_mqtt(wsi) && w->client_mux_migrated &&
			    lwsi_state(w) == LRS_ESTABLISHED) {

				if (lws_wsi_mqtt_adopt(w, wsi)) {
					lwsl_wsi_notice(w, "join mqtt directly");
					lws_dll2_remove(&wsi->dll2_cli_txn_queue);
					wsi->client_mux_substream = 1;

					lws_vhost_unlock(wsi->a.vhost); /* } ---------- */
					lws_context_unlock(wsi->a.context); /* -------------- cx { */

					return ACTIVE_CONNS_MUXED;
				}
			}
#endif

			/*
			 * If the connection is viable but not yet in a usable
			 * state, let's attach ourselves to it and wait for it
			 * to get there or fail.
			 */

			lwsl_wsi_notice(wsi, "apply txn queue %s, state 0x%lx",
					     lws_wsi_tag(w),
					     (unsigned long)w->wsistate);
			/*
			 * ...let's add ourselves to his transaction queue...
			 * we are adding ourselves at the TAIL
			 */
			lws_dll2_add_tail(&wsi->dll2_cli_txn_queue,
					  &w->dll2_cli_txn_queue_owner);

			if (lwsi_state(w) == LRS_IDLING)
				_lws_generic_transaction_completed_active_conn(&w, 0);

			/*
			 * For eg, h1 next we'd pipeline our headers out on him,
			 * and wait for our turn at client transaction_complete
			 * to take over parsing the rx.
			 */
			lws_vhost_unlock(wsi->a.vhost); /* } ---------- */
			lws_context_unlock(wsi->a.context); /* -------------- cx { */

			*nwsi = w;

			return ACTIVE_CONNS_QUEUED;
		}

	} lws_end_foreach_dll_safe(d, d1);

solo:
	lws_vhost_unlock(wsi->a.vhost); /* } ---------------------------------- */
	lws_context_unlock(wsi->a.context); /* -------------- cx { */

	/* there is nobody already connected in the same way */

	return ACTIVE_CONNS_SOLO;
}